

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesDH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint32_t uVar7;
  size_t sVar8;
  size_t sVar9;
  uint16_t *puVar10;
  uint32_t *puVar11;
  BrotliEncoderDictionary *pBVar12;
  HasherCommon *pHVar13;
  size_t sVar14;
  size_t sVar15;
  PreparedDictionary *pPVar16;
  BrotliDictionary *pBVar17;
  size_t sVar18;
  undefined8 uVar19;
  int iVar20;
  byte bVar21;
  bool bVar22;
  uint uVar23;
  uint32_t uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  undefined8 *puVar29;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  size_t sVar33;
  long lVar34;
  ulong uVar35;
  uint8_t *puVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong *puVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  uint8_t *puVar45;
  uint8_t *s1_orig_1;
  uint16_t uVar46;
  uint uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong *puVar50;
  byte bVar51;
  uint uVar52;
  int iVar53;
  ulong uVar54;
  long lVar55;
  bool bVar56;
  long lVar57;
  uint8_t *puVar58;
  uint *puVar59;
  uint8_t *s1_orig_3;
  uint8_t *puVar60;
  ulong *puVar61;
  uint8_t *s1_orig_4;
  ulong *puVar62;
  ulong uVar63;
  ulong uVar64;
  int iVar65;
  uint8_t *s1_orig_6;
  size_t sVar66;
  uint16_t *num;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  size_t local_198;
  ulong local_190;
  int local_184;
  ulong local_180;
  ulong local_178;
  ulong local_158;
  ulong local_148;
  Command *local_140;
  ulong local_128;
  ulong local_120;
  uint local_114;
  ulong local_100;
  ulong local_e8;
  ulong local_d0;
  
  iVar25 = params->lgwin;
  uVar4 = (position - 3) + num_bytes;
  sVar33 = position;
  if (3 < num_bytes) {
    sVar33 = uVar4;
  }
  sVar8 = params->stream_offset;
  lVar34 = 0x200;
  if (params->quality < 9) {
    lVar34 = 0x40;
  }
  local_198 = *last_insert_len;
  uVar1 = position + num_bytes;
  sVar9 = (params->dictionary).compound.total_size;
  uVar23 = *(uint *)((long)&(hasher->privat)._H35.hb.table + 4);
  if (4 < (int)uVar23) {
    iVar53 = *dist_cache;
    dist_cache[4] = iVar53 + -1;
    dist_cache[5] = iVar53 + 1;
    dist_cache[6] = iVar53 + -2;
    dist_cache[7] = iVar53 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar53 + 3,iVar53 + -3);
    if (10 < uVar23) {
      iVar53 = dist_cache[1];
      dist_cache[10] = iVar53 + -1;
      dist_cache[0xb] = iVar53 + 1;
      dist_cache[0xc] = iVar53 + -2;
      dist_cache[0xd] = iVar53 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar53 + 3,iVar53 + -3);
    }
  }
  if (position + 4 < uVar1) {
    uVar5 = (1L << ((byte)iVar25 & 0x3f)) - 0x10;
    local_148 = lVar34 + position;
    puVar10 = (hasher->privat)._H5.num_;
    puVar11 = (hasher->privat)._H5.buckets_;
    lVar26 = sVar9 + 1;
    lVar3 = position - 1;
    local_140 = commands;
    uVar43 = position;
    do {
      uVar49 = uVar5;
      if (uVar43 < uVar5) {
        uVar49 = uVar43;
      }
      uVar30 = sVar8 + uVar43;
      if (uVar5 <= sVar8 + uVar43) {
        uVar30 = uVar5;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_114 = 0;
        local_e8 = 0;
      }
      else {
        if (uVar43 == 0) {
          local_e8 = 0;
LAB_01bd976a:
          uVar27 = 0;
        }
        else {
          local_e8 = (ulong)ringbuffer[uVar43 - 1 & ringbuffer_mask];
          if (uVar43 == 1) goto LAB_01bd976a;
          uVar27 = (ulong)ringbuffer[uVar43 - 2 & ringbuffer_mask];
        }
        local_114 = (uint)(params->dictionary).contextual.context_map
                          [literal_context_lut[uVar27 + 0x100] | literal_context_lut[local_e8]];
      }
      local_1b8 = uVar1 - uVar43;
      pBVar12 = (params->dictionary).contextual.dict[local_114];
      uVar27 = (params->dist).max_distance;
      uVar63 = uVar43 & ringbuffer_mask;
      uVar48 = (ulong)(hasher->privat)._H5.num_last_distances_to_check_;
      if (uVar48 != 0) {
        puVar45 = ringbuffer + uVar63;
        local_158 = 0x7e4;
        uVar42 = 0;
        uVar54 = 0;
        local_1b0 = 0;
        local_1d0 = 0;
LAB_01bd9800:
        uVar28 = (ulong)dist_cache[uVar54];
        if (((uVar28 <= uVar49) && (uVar43 - uVar28 < uVar43)) &&
           (uVar42 + uVar63 <= ringbuffer_mask)) {
          uVar35 = uVar43 - uVar28 & ringbuffer_mask;
          uVar44 = uVar35 + uVar42;
          if ((ringbuffer_mask < uVar44) || (ringbuffer[uVar42 + uVar63] != ringbuffer[uVar44]))
          goto LAB_01bd98c7;
          puVar36 = ringbuffer + uVar35;
          uVar44 = local_1b8;
          puVar58 = puVar45;
          puVar60 = puVar36;
          if (7 < local_1b8) {
            lVar57 = 0;
LAB_01bd986a:
            if (*(ulong *)(puVar45 + lVar57) == *(ulong *)(puVar36 + lVar57)) goto code_r0x01bd9878;
            uVar35 = *(ulong *)(puVar36 + lVar57) ^ *(ulong *)(puVar45 + lVar57);
            uVar44 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar57;
            goto LAB_01bd98f6;
          }
          goto LAB_01bd988d;
        }
        goto LAB_01bd98c7;
      }
      local_158 = 0x7e4;
      local_1d0 = 0;
      local_1b0 = 0;
      uVar42 = 0;
LAB_01bd9989:
      uVar52 = (uint)(*(int *)(ringbuffer + uVar63) * 0x1e35a7bd) >>
               (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
      uVar23 = uVar52 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f);
      puVar2 = (ulong *)(ringbuffer + uVar63);
      uVar6 = puVar10[uVar52];
      uVar28 = (ulong)uVar6;
      uVar48 = (hasher->privat)._H5.block_size_;
      uVar54 = 0;
      if (uVar48 <= uVar28) {
        uVar54 = uVar28 - uVar48;
      }
      uVar47 = (hasher->privat)._H5.block_mask_;
      if (uVar54 < uVar28) {
LAB_01bd9a14:
        uVar28 = uVar28 - 1;
        uVar44 = uVar43 - puVar11[(ulong)uVar23 + (ulong)((uint)uVar28 & uVar47)];
        if (uVar44 <= uVar49) {
          if (uVar42 + uVar63 <= ringbuffer_mask) {
            uVar31 = (ulong)(puVar11[(ulong)uVar23 + (ulong)((uint)uVar28 & uVar47)] &
                            (uint)ringbuffer_mask);
            uVar35 = uVar42 + uVar31;
            if ((ringbuffer_mask < uVar35) || (ringbuffer[uVar42 + uVar63] != ringbuffer[uVar35]))
            goto LAB_01bd9ad7;
            puVar60 = ringbuffer + uVar31;
            puVar62 = puVar2;
            uVar35 = local_1b8;
            puVar45 = puVar60;
            if (7 < local_1b8) {
              lVar57 = 0;
LAB_01bd9a8a:
              if (*(ulong *)((long)puVar2 + lVar57) == *(ulong *)(puVar60 + lVar57))
              goto code_r0x01bd9a99;
              uVar31 = *(ulong *)(puVar60 + lVar57) ^ *(ulong *)((long)puVar2 + lVar57);
              uVar35 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = (uVar35 >> 3 & 0x1fffffff) + lVar57;
              goto LAB_01bd9afd;
            }
            goto LAB_01bd9aae;
          }
          goto LAB_01bd9ad7;
        }
      }
LAB_01bd9b55:
      puVar11[(ulong)uVar23 + (ulong)(uVar47 & uVar6)] = (uint32_t)uVar43;
      puVar10[uVar52] = uVar6 + 1;
      if (local_158 == 0x7e4) {
        pHVar13 = (hasher->privat)._H5.common_;
        uVar49 = pHVar13->dict_num_lookups;
        local_180 = pHVar13->dict_num_matches;
        local_158 = 0x7e4;
        if (uVar49 >> 7 <= local_180) {
          uVar42 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          puVar45 = pBVar12->hash_table_lengths;
          local_158 = 0x7e4;
          local_184 = 0;
          bVar56 = true;
LAB_01bdabed:
          uVar49 = uVar49 + 1;
          pHVar13->dict_num_lookups = uVar49;
          bVar32 = puVar45[uVar42];
          uVar54 = (ulong)bVar32;
          if ((uVar54 != 0) && (uVar54 <= local_1b8)) {
            pBVar17 = pBVar12->words;
            puVar40 = (ulong *)(pBVar17->data +
                               (ulong)pBVar17->offsets_by_length[uVar54] +
                               pBVar12->hash_table_words[uVar42] * uVar54);
            uVar28 = uVar54;
            puVar62 = puVar2;
            if (7 < bVar32) {
              lVar57 = 0;
LAB_01bdac4d:
              if (*puVar40 == *puVar62) goto code_r0x01bdac58;
              uVar44 = *puVar62 ^ *puVar40;
              uVar28 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (uVar28 >> 3 & 0x1fffffff) - lVar57;
              goto LAB_01bdacbb;
            }
            goto LAB_01bdac7f;
          }
          goto LAB_01bdad2e;
        }
      }
      local_184 = 0;
      local_120 = local_1b0;
LAB_01bd9bb6:
      sVar14 = (params->dictionary).compound.num_chunks;
      sVar15 = (params->dictionary).compound.total_size;
      local_128 = local_1d0;
      if (sVar14 != 0) {
        sVar66 = 0;
LAB_01bd9bf4:
        pPVar16 = (params->dictionary).compound.chunks[sVar66];
        bVar32 = (byte)pPVar16->bucket_bits;
        bVar51 = (byte)pPVar16->slot_bits;
        bVar21 = -(char)pPVar16->hash_bits;
        uVar49 = ((*puVar2 << (bVar21 & 0x3f)) >> (bVar21 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                 (-bVar32 & 0x3f);
        lVar57 = (1L << (bVar51 & 0x3f)) * 4;
        lVar41 = (1L << (bVar32 & 0x3f)) * 2;
        bVar51 = -bVar51;
        puVar29 = (undefined8 *)
                  ((long)&pPVar16[1].magic + (ulong)pPVar16->num_items * 4 + lVar41 + lVar57);
        if (pPVar16->magic != 0xdebcede0) {
          puVar29 = (undefined8 *)*puVar29;
        }
        uVar54 = (uVar30 + sVar15) - (params->dictionary).compound.chunk_offsets[sVar66];
        uVar42 = (ulong)pPVar16->source_size;
        uVar6 = *(ushort *)((long)&pPVar16[1].magic + (uVar49 & 0xffffffff) * 2 + lVar57);
        puVar59 = (uint *)((long)&pPVar16[1].magic +
                          (ulong)((uint)uVar6 +
                                 (&pPVar16[1].magic)
                                 [(uint)((int)uVar49 << (bVar51 & 0x1f)) >> (bVar51 & 0x1f)]) * 4 +
                          lVar41 + lVar57);
        lVar57 = 0;
        uVar49 = local_120;
LAB_01bd9cb9:
        uVar28 = (ulong)dist_cache[lVar57];
        if ((uVar54 - uVar42 < uVar28) && (uVar28 <= uVar54)) {
          uVar44 = uVar42 - (uVar54 - uVar28);
          if (local_1b8 <= uVar44) {
            uVar44 = local_1b8;
          }
          lVar37 = (uVar54 - uVar28) + (long)puVar29;
          lVar41 = lVar37;
          puVar62 = puVar2;
          if (7 < uVar44) {
            lVar55 = 0;
LAB_01bd9cf8:
            if (*(ulong *)((long)puVar2 + lVar55) == *(ulong *)(lVar37 + lVar55))
            goto code_r0x01bd9d06;
            uVar35 = *(ulong *)(lVar37 + lVar55) ^ *(ulong *)((long)puVar2 + lVar55);
            uVar44 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar55;
            goto LAB_01bd9d5f;
          }
          goto LAB_01bd9d23;
        }
        goto LAB_01bd9dc5;
      }
LAB_01bd9f39:
      if (local_158 < 0x7e5) {
        local_198 = local_198 + 1;
        position = uVar43 + 1;
        if (local_148 < position) {
          if ((uint)((int)lVar34 * 4) + local_148 < position) {
            uVar49 = uVar43 + 0x11;
            if (uVar1 - 4 <= uVar43 + 0x11) {
              uVar49 = uVar1 - 4;
            }
            if (position < uVar49) {
              uVar24 = (hasher->privat)._H35.hb.state;
              uVar23 = (hasher->privat)._H5.block_mask_;
              uVar7 = (hasher->privat)._H6.block_mask_;
              do {
                uVar52 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         ((byte)uVar24 & 0x1f);
                uVar6 = puVar10[uVar52];
                puVar11[(ulong)(uVar23 & uVar6) + (ulong)(uVar52 << ((byte)uVar7 & 0x1f))] =
                     (uint32_t)position;
                puVar10[uVar52] = uVar6 + 1;
                local_198 = local_198 + 4;
                position = position + 4;
              } while (position < uVar49);
            }
          }
          else {
            uVar49 = uVar43 + 9;
            if (uVar4 <= uVar43 + 9) {
              uVar49 = uVar4;
            }
            if (position < uVar49) {
              uVar24 = (hasher->privat)._H35.hb.state;
              uVar23 = (hasher->privat)._H5.block_mask_;
              uVar7 = (hasher->privat)._H6.block_mask_;
              do {
                uVar52 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         ((byte)uVar24 & 0x1f);
                uVar6 = puVar10[uVar52];
                puVar11[(ulong)(uVar23 & uVar6) + (ulong)(uVar52 << ((byte)uVar7 & 0x1f))] =
                     (uint32_t)position;
                puVar10[uVar52] = uVar6 + 1;
                local_198 = local_198 + 2;
                position = position + 2;
              } while (position < uVar49);
            }
          }
        }
      }
      else {
        iVar25 = (hasher->privat)._H5.num_last_distances_to_check_;
        uVar24 = (hasher->privat)._H35.hb.state;
        uVar23 = (hasher->privat)._H5.block_mask_;
        uVar7 = (hasher->privat)._H6.block_mask_;
        uVar30 = local_198 + 4;
        uVar49 = sVar8 + 1 + uVar43;
        local_d0 = (lVar3 + num_bytes) - uVar43;
        iVar53 = 0;
        do {
          uVar63 = uVar5;
          if (uVar49 < uVar5) {
            uVar63 = uVar49;
          }
          local_1b8 = local_1b8 - 1;
          uVar42 = local_120 - 1;
          if (local_1b8 <= local_120 - 1) {
            uVar42 = local_1b8;
          }
          if (4 < params->quality) {
            uVar42 = 0;
          }
          uVar54 = uVar43 + 1;
          uVar28 = uVar5;
          if (uVar54 < uVar5) {
            uVar28 = uVar54;
          }
          local_100 = sVar8 + uVar43 + 1;
          if (uVar5 <= local_100) {
            local_100 = uVar5;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_114 = (uint)(params->dictionary).contextual.context_map
                              [literal_context_lut[local_e8 + 0x100] |
                               literal_context_lut[ringbuffer[uVar43 & ringbuffer_mask]]];
            local_e8 = (ulong)ringbuffer[uVar43 & ringbuffer_mask];
          }
          uVar44 = uVar54 & ringbuffer_mask;
          pBVar12 = (params->dictionary).contextual.dict[local_114];
          if (iVar25 != 0) {
            puVar45 = ringbuffer + uVar44;
            local_1c0 = 0x7e4;
            uVar35 = 0;
            local_1d0 = 0;
            local_1c8 = 0;
LAB_01bda0d6:
            uVar31 = (ulong)dist_cache[uVar35];
            if (((uVar31 <= uVar28) && (uVar54 - uVar31 < uVar54)) &&
               (uVar42 + uVar44 <= ringbuffer_mask)) {
              uVar38 = uVar54 - uVar31 & ringbuffer_mask;
              uVar64 = uVar38 + uVar42;
              if ((ringbuffer_mask < uVar64) || (ringbuffer[uVar42 + uVar44] != ringbuffer[uVar64]))
              goto LAB_01bda21e;
              puVar36 = ringbuffer + uVar38;
              puVar58 = puVar45;
              puVar60 = puVar36;
              uVar64 = local_1b8;
              if (7 < local_1b8) {
                lVar57 = 0;
LAB_01bda13c:
                if (*(ulong *)(puVar45 + lVar57) == *(ulong *)(puVar36 + lVar57))
                goto code_r0x01bda149;
                uVar38 = *(ulong *)(puVar36 + lVar57) ^ *(ulong *)(puVar45 + lVar57);
                uVar64 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                  }
                }
                uVar64 = (uVar64 >> 3 & 0x1fffffff) + lVar57;
                goto LAB_01bda1ae;
              }
              goto LAB_01bda15e;
            }
            goto LAB_01bda21e;
          }
          local_1c0 = 0x7e4;
          local_1c8 = 0;
          local_1d0 = 0;
LAB_01bda248:
          puVar2 = (ulong *)(ringbuffer + uVar44);
          uVar47 = (uint)(*(int *)(ringbuffer + uVar44) * 0x1e35a7bd) >> ((byte)uVar24 & 0x1f);
          uVar52 = uVar47 << ((byte)uVar7 & 0x1f);
          uVar6 = puVar10[uVar47];
          uVar31 = (ulong)uVar6;
          uVar35 = 0;
          if (uVar48 <= uVar31) {
            uVar35 = uVar31 - uVar48;
          }
          if (uVar35 < uVar31) {
LAB_01bda2bf:
            uVar31 = uVar31 - 1;
            uVar64 = uVar54 - puVar11[(ulong)uVar52 +
                                      (ulong)((uint)uVar31 & (hasher->privat)._H5.block_mask_)];
            if (uVar64 <= uVar28) {
              if (uVar44 + uVar42 <= ringbuffer_mask) {
                uVar39 = (ulong)(puVar11[(ulong)uVar52 +
                                         (ulong)((uint)uVar31 & (hasher->privat)._H5.block_mask_)] &
                                (uint)ringbuffer_mask);
                uVar38 = uVar39 + uVar42;
                if ((ringbuffer_mask < uVar38) ||
                   (ringbuffer[uVar44 + uVar42] != ringbuffer[uVar38])) goto LAB_01bda3d1;
                puVar60 = ringbuffer + uVar39;
                puVar45 = puVar60;
                uVar38 = local_1b8;
                puVar62 = puVar2;
                if (7 < local_1b8) {
                  lVar57 = 0;
LAB_01bda335:
                  if (*(ulong *)((long)puVar2 + lVar57) == *(ulong *)(puVar60 + lVar57))
                  goto code_r0x01bda343;
                  uVar39 = *(ulong *)(puVar60 + lVar57) ^ *(ulong *)((long)puVar2 + lVar57);
                  uVar38 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar57;
                  goto LAB_01bda397;
                }
                goto LAB_01bda358;
              }
              goto LAB_01bda3d1;
            }
          }
LAB_01bda3e9:
          puVar11[(ulong)uVar52 + (ulong)(uVar23 & uVar6)] = (uint32_t)uVar54;
          puVar10[uVar47] = uVar6 + 1;
          local_190 = local_1d0;
          if (local_1c0 == 0x7e4) {
            pHVar13 = (hasher->privat)._H5.common_;
            uVar42 = pHVar13->dict_num_lookups;
            local_148 = pHVar13->dict_num_matches;
            if (uVar42 >> 7 <= local_148) {
              uVar28 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar45 = pBVar12->hash_table_lengths;
              iVar65 = 0;
              local_1c0 = 0x7e4;
              bVar56 = true;
LAB_01bda4bf:
              uVar42 = uVar42 + 1;
              pHVar13->dict_num_lookups = uVar42;
              bVar32 = puVar45[uVar28];
              uVar35 = (ulong)bVar32;
              if ((uVar35 != 0) && (uVar35 <= local_1b8)) {
                pBVar17 = pBVar12->words;
                puVar40 = (ulong *)(pBVar17->data +
                                   (ulong)pBVar17->offsets_by_length[uVar35] +
                                   pBVar12->hash_table_words[uVar28] * uVar35);
                uVar31 = uVar35;
                puVar62 = puVar2;
                if (7 < bVar32) {
                  lVar57 = 0;
LAB_01bda515:
                  if (*puVar40 == *puVar62) goto code_r0x01bda520;
                  uVar64 = *puVar62 ^ *puVar40;
                  uVar31 = 0;
                  if (uVar64 != 0) {
                    for (; (uVar64 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar57;
                  goto LAB_01bda57f;
                }
                goto LAB_01bda547;
              }
              goto LAB_01bda665;
            }
            iVar65 = 0;
            local_1c0 = 0x7e4;
          }
          else {
            iVar65 = 0;
          }
LAB_01bda685:
          local_178 = local_1c8;
          if (sVar14 != 0) {
            sVar66 = 0;
LAB_01bda6c9:
            pPVar16 = (params->dictionary).compound.chunks[sVar66];
            bVar32 = (byte)pPVar16->bucket_bits;
            bVar51 = (byte)pPVar16->slot_bits;
            bVar21 = -(char)pPVar16->hash_bits;
            uVar42 = ((*puVar2 << (bVar21 & 0x3f)) >> (bVar21 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                     (-bVar32 & 0x3f);
            lVar57 = (1L << (bVar51 & 0x3f)) * 4;
            lVar41 = (1L << (bVar32 & 0x3f)) * 2;
            bVar51 = -bVar51;
            puVar29 = (undefined8 *)
                      ((long)&pPVar16[1].magic + (ulong)pPVar16->num_items * 4 + lVar41 + lVar57);
            if (pPVar16->magic != 0xdebcede0) {
              puVar29 = (undefined8 *)*puVar29;
            }
            sVar18 = (params->dictionary).compound.chunk_offsets[sVar66];
            uVar28 = (local_100 + sVar15) - sVar18;
            uVar35 = (ulong)pPVar16->source_size;
            uVar6 = *(ushort *)((long)&pPVar16[1].magic + (uVar42 & 0xffffffff) * 2 + lVar57);
            puVar59 = (uint *)((long)&pPVar16[1].magic +
                              (ulong)((uint)uVar6 +
                                     (&pPVar16[1].magic)
                                     [(uint)((int)uVar42 << (bVar51 & 0x1f)) >> (bVar51 & 0x1f)]) *
                              4 + lVar41 + lVar57);
            lVar57 = 0;
            uVar42 = local_190;
LAB_01bda7a8:
            uVar31 = (ulong)dist_cache[lVar57];
            if ((uVar28 - uVar35 < uVar31) && (uVar31 <= uVar28)) {
              uVar64 = uVar35 - (uVar28 - uVar31);
              if (local_1b8 <= uVar64) {
                uVar64 = local_1b8;
              }
              lVar37 = (uVar28 - uVar31) + (long)puVar29;
              puVar62 = puVar2;
              lVar41 = lVar37;
              if (7 < uVar64) {
                lVar41 = ((uVar63 + sVar15) - sVar18) - uVar31;
                lVar55 = 0;
LAB_01bda7e7:
                uVar38 = *(ulong *)((long)puVar29 + lVar55 + lVar41);
                if (*(ulong *)((long)puVar2 + lVar55) == uVar38) goto code_r0x01bda7f5;
                uVar38 = uVar38 ^ *(ulong *)((long)puVar2 + lVar55);
                uVar64 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                  }
                }
                uVar64 = (uVar64 >> 3 & 0x1fffffff) + lVar55;
                goto LAB_01bda852;
              }
              goto LAB_01bda811;
            }
            goto LAB_01bda8b7;
          }
LAB_01bdaa5c:
          if (local_1c0 < local_158 + 0xaf) {
            uVar54 = uVar43;
            local_190 = local_120;
            iVar65 = local_184;
            sVar66 = local_198;
            local_100 = uVar43 + sVar8;
            if (uVar5 <= uVar43 + sVar8) {
              local_100 = uVar5;
            }
            break;
          }
          local_128 = local_178;
          sVar66 = uVar30;
          if (iVar53 == 3) break;
          local_198 = local_198 + 1;
          iVar53 = iVar53 + 1;
          uVar63 = uVar43 + 5;
          uVar49 = uVar49 + 1;
          local_d0 = local_d0 - 1;
          local_158 = local_1c0;
          uVar43 = uVar54;
          local_120 = local_190;
          sVar66 = local_198;
          local_184 = iVar65;
        } while (uVar63 < uVar1);
        local_198 = sVar66;
        local_100 = local_100 + sVar9;
        if (local_100 < local_128) {
LAB_01bdae1a:
          uVar43 = local_128 + 0xf;
LAB_01bdae1e:
          if ((local_128 <= local_100) && (uVar43 != 0)) {
            dist_cache[3] = dist_cache[2];
            uVar19 = *(undefined8 *)dist_cache;
            *(undefined8 *)(dist_cache + 1) = uVar19;
            iVar25 = (int)local_128;
            *dist_cache = iVar25;
            uVar23 = *(uint *)((long)&(hasher->privat)._H35.hb.table + 4);
            if (4 < (int)uVar23) {
              dist_cache[4] = iVar25 + -1;
              dist_cache[5] = iVar25 + 1;
              dist_cache[6] = iVar25 + -2;
              dist_cache[7] = iVar25 + 2;
              dist_cache[8] = iVar25 + -3;
              dist_cache[9] = iVar25 + 3;
              if (10 < uVar23) {
                iVar25 = (int)uVar19;
                dist_cache[10] = iVar25 + -1;
                dist_cache[0xb] = iVar25 + 1;
                dist_cache[0xc] = iVar25 + -2;
                dist_cache[0xd] = iVar25 + 2;
                *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar25 + 3,iVar25 + -3);
              }
            }
          }
        }
        else {
          if (local_128 != (long)*dist_cache) {
            uVar43 = 1;
            if (local_128 != (long)dist_cache[1]) {
              uVar43 = (local_128 + 3) - (long)*dist_cache;
              if (uVar43 < 7) {
                bVar32 = (byte)((int)uVar43 << 2);
                uVar23 = 0x9750468;
              }
              else {
                uVar43 = (local_128 + 3) - (long)dist_cache[1];
                if (6 < uVar43) {
                  uVar43 = 2;
                  if ((local_128 != (long)dist_cache[2]) &&
                     (uVar43 = 3, local_128 != (long)dist_cache[3])) goto LAB_01bdae1a;
                  goto LAB_01bdae1e;
                }
                bVar32 = (byte)((int)uVar43 << 2);
                uVar23 = 0xfdb1ace;
              }
              uVar43 = (ulong)(uVar23 >> (bVar32 & 0x1f) & 0xf);
            }
            goto LAB_01bdae1e;
          }
          uVar43 = 0;
        }
        local_140->insert_len_ = (uint32_t)local_198;
        local_140->copy_len_ = iVar65 << 0x19 | (uint)local_190;
        uVar30 = (ulong)(params->dist).num_direct_distance_codes;
        uVar49 = uVar30 + 0x10;
        uVar24 = 0;
        if (uVar49 <= uVar43) {
          uVar23 = (params->dist).distance_postfix_bits;
          bVar32 = (byte)uVar23;
          uVar30 = ((4L << (bVar32 & 0x3f)) + (uVar43 - uVar30)) - 0x10;
          uVar52 = 0x1f;
          uVar47 = (uint)uVar30;
          if (uVar47 != 0) {
            for (; uVar47 >> uVar52 == 0; uVar52 = uVar52 - 1) {
            }
          }
          uVar52 = (uVar52 ^ 0xffffffe0) + 0x1f;
          uVar27 = (ulong)((uVar30 >> ((ulong)uVar52 & 0x3f) & 1) != 0);
          lVar57 = (ulong)uVar52 - (ulong)uVar23;
          uVar43 = (~(-1 << (bVar32 & 0x1f)) & uVar47) + uVar49 +
                   (uVar27 + lVar57 * 2 + 0xfffe << (bVar32 & 0x3f)) | lVar57 * 0x400;
          uVar24 = (uint32_t)(uVar30 - (uVar27 + 2 << ((byte)uVar52 & 0x3f)) >> (bVar32 & 0x3f));
        }
        local_140->dist_prefix_ = (uint16_t)uVar43;
        local_140->dist_extra_ = uVar24;
        uVar49 = local_198;
        if (5 < local_198) {
          if (local_198 < 0x82) {
            uVar23 = 0x1f;
            uVar52 = (uint)(local_198 - 2);
            if (uVar52 != 0) {
              for (; uVar52 >> uVar23 == 0; uVar23 = uVar23 - 1) {
              }
            }
            uVar49 = (ulong)((int)(local_198 - 2 >> ((char)(uVar23 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar23 ^ 0xffffffe0) * 2 + 0x40);
          }
          else if (local_198 < 0x842) {
            uVar52 = (uint32_t)local_198 - 0x42;
            uVar23 = 0x1f;
            if (uVar52 != 0) {
              for (; uVar52 >> uVar23 == 0; uVar23 = uVar23 - 1) {
              }
            }
            uVar49 = (ulong)((uVar23 ^ 0xffe0) + 0x2a);
          }
          else {
            uVar49 = 0x15;
            if (0x1841 < local_198) {
              uVar49 = (ulong)(ushort)(0x17 - (local_198 < 0x5842));
            }
          }
        }
        uVar23 = iVar65 + (uint)local_190;
        if (uVar23 < 10) {
          uVar52 = uVar23 - 2;
        }
        else if (uVar23 < 0x86) {
          uVar23 = uVar23 - 6;
          uVar52 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> uVar52 == 0; uVar52 = uVar52 - 1) {
            }
          }
          uVar52 = (uVar23 >> ((char)(uVar52 ^ 0xffffffe0) + 0x1fU & 0x1f)) +
                   (uVar52 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar52 = 0x17;
          if (uVar23 < 0x846) {
            uVar52 = 0x1f;
            if (uVar23 - 0x46 != 0) {
              for (; uVar23 - 0x46 >> uVar52 == 0; uVar52 = uVar52 - 1) {
              }
            }
            uVar52 = (uVar52 ^ 0xffe0) + 0x2c;
          }
        }
        uVar6 = (ushort)uVar52;
        uVar46 = (uVar6 & 7) + ((ushort)uVar49 & 7) * 8;
        if ((((uVar43 & 0x3ff) == 0) && ((ushort)uVar49 < 8)) && (uVar6 < 0x10)) {
          if (7 < uVar6) {
            uVar46 = uVar46 + 0x40;
          }
        }
        else {
          iVar25 = (int)((uVar49 & 0xffff) >> 3) * 3 + ((uVar52 & 0xffff) >> 3);
          uVar46 = uVar46 + ((ushort)(0x520d40 >> ((char)iVar25 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar25 * 0x40 + 0x40;
        }
        local_140->cmd_prefix_ = uVar46;
        *num_literals = *num_literals + local_198;
        position = uVar54 + local_190;
        uVar43 = sVar33;
        if (position < sVar33) {
          uVar43 = position;
        }
        uVar49 = uVar54 + 2;
        if (local_128 < local_190 >> 2) {
          uVar30 = position + local_128 * -4;
          if (uVar30 < uVar49) {
            uVar30 = uVar49;
          }
          uVar49 = uVar30;
          if (uVar43 < uVar30) {
            uVar49 = uVar43;
          }
        }
        local_148 = uVar54 + lVar34 + local_190 * 2;
        local_140 = local_140 + 1;
        if (uVar49 < uVar43) {
          uVar24 = (hasher->privat)._H35.hb.state;
          uVar23 = (hasher->privat)._H5.block_mask_;
          uVar7 = (hasher->privat)._H6.block_mask_;
          do {
            uVar52 = (uint)(*(int *)(ringbuffer + (uVar49 & ringbuffer_mask)) * 0x1e35a7bd) >>
                     ((byte)uVar24 & 0x1f);
            uVar6 = puVar10[uVar52];
            puVar11[(ulong)(uVar23 & uVar6) + (ulong)(uVar52 << ((byte)uVar7 & 0x1f))] =
                 (uint32_t)uVar49;
            puVar10[uVar52] = uVar6 + 1;
            uVar49 = uVar49 + 1;
          } while (uVar43 != uVar49);
          local_198 = 0;
        }
        else {
          local_198 = 0;
        }
      }
      uVar43 = position;
    } while (position + 4 < uVar1);
  }
  else {
    local_140 = commands;
  }
  *last_insert_len = (local_198 + uVar1) - position;
  *num_commands = *num_commands + ((long)local_140 - (long)commands >> 4);
  return;
code_r0x01bd9878:
  uVar44 = uVar44 - 8;
  lVar57 = lVar57 + 8;
  if (uVar44 < 8) goto code_r0x01bd9886;
  goto LAB_01bd986a;
code_r0x01bd9886:
  puVar60 = puVar36 + lVar57;
  puVar58 = puVar45 + lVar57;
LAB_01bd988d:
  if (uVar44 != 0) {
    uVar35 = 0;
    do {
      uVar31 = uVar35;
      if (puVar60[uVar35] != puVar58[uVar35]) break;
      uVar35 = uVar35 + 1;
      uVar31 = uVar44;
    } while (uVar44 != uVar35);
    puVar60 = puVar60 + uVar31;
  }
  uVar44 = (long)puVar60 - (long)puVar36;
LAB_01bd98f6:
  if (((2 < uVar44) || ((uVar54 < 2 && (uVar44 == 2)))) &&
     (uVar35 = uVar44 * 0x87 + 0x78f, local_158 < uVar35)) {
    if (uVar54 != 0) {
      uVar35 = uVar35 - ((0x1ca10U >> ((byte)uVar54 & 0xe) & 0xe) + 0x27);
    }
    if (local_158 < uVar35) {
      local_158 = uVar35;
      uVar42 = uVar44;
      local_1d0 = uVar28;
      local_1b0 = uVar44;
    }
  }
LAB_01bd98c7:
  uVar54 = uVar54 + 1;
  if (uVar54 == uVar48) goto LAB_01bd9989;
  goto LAB_01bd9800;
code_r0x01bd9a99:
  uVar35 = uVar35 - 8;
  lVar57 = lVar57 + 8;
  if (uVar35 < 8) goto code_r0x01bd9aa7;
  goto LAB_01bd9a8a;
code_r0x01bd9aa7:
  puVar45 = puVar60 + lVar57;
  puVar62 = (ulong *)(lVar57 + (long)puVar2);
LAB_01bd9aae:
  puVar58 = puVar45;
  if (uVar35 != 0) {
    puVar58 = puVar45 + uVar35;
    uVar31 = 0;
    do {
      if (puVar45[uVar31] != *(uint8_t *)((long)puVar62 + uVar31)) {
        puVar58 = puVar45 + uVar31;
        break;
      }
      uVar31 = uVar31 + 1;
    } while (uVar35 != uVar31);
  }
  uVar35 = (long)puVar58 - (long)puVar60;
LAB_01bd9afd:
  if (3 < uVar35) {
    iVar25 = 0x1f;
    if ((uint)uVar44 != 0) {
      for (; (uint)uVar44 >> iVar25 == 0; iVar25 = iVar25 + -1) {
      }
    }
    uVar31 = (ulong)(iVar25 * -0x1e + 0x780) + uVar35 * 0x87;
    if (local_158 < uVar31) {
      local_158 = uVar31;
      uVar42 = uVar35;
      local_1b0 = uVar35;
      local_1d0 = uVar44;
    }
  }
LAB_01bd9ad7:
  if (uVar28 <= uVar54) goto LAB_01bd9b55;
  goto LAB_01bd9a14;
code_r0x01bdac58:
  puVar40 = puVar40 + 1;
  puVar62 = puVar62 + 1;
  lVar41 = uVar54 + lVar57;
  lVar57 = lVar57 + -8;
  if (lVar41 - 8U < 8) goto code_r0x01bdac72;
  goto LAB_01bdac4d;
code_r0x01bdac72:
  uVar28 = lVar57 + uVar54;
  if (lVar57 + uVar54 != 0) {
LAB_01bdac7f:
    uVar44 = 0;
    do {
      uVar35 = uVar44;
      if (*(char *)((long)puVar62 + uVar44) != *(char *)((long)puVar40 + uVar44)) break;
      uVar44 = uVar44 + 1;
      uVar35 = uVar28;
    } while (uVar28 != uVar44);
    puVar62 = (ulong *)((long)puVar62 + uVar35);
  }
  uVar28 = (long)puVar62 - (long)puVar2;
LAB_01bdacbb:
  if (((uVar28 != 0) && (uVar54 < pBVar12->cutoffTransformsCount + uVar28)) &&
     (uVar54 = (ulong)pBVar12->hash_table_words[uVar42] + lVar26 + uVar30 +
               ((ulong)((uint)(pBVar12->cutoffTransforms >>
                              ((char)(uVar54 - uVar28) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar54 - uVar28) * 4 << (pBVar17->size_bits_by_length[uVar54] & 0x3f)),
     uVar54 <= uVar27)) {
    iVar25 = 0x1f;
    if ((uint)uVar54 != 0) {
      for (; (uint)uVar54 >> iVar25 == 0; iVar25 = iVar25 + -1) {
      }
    }
    uVar44 = (uVar28 * 0x87 - (ulong)(uint)(iVar25 * 0x1e)) + 0x780;
    if (local_158 <= uVar44) {
      local_184 = (uint)bVar32 - (int)uVar28;
      local_180 = local_180 + 1;
      pHVar13->dict_num_matches = local_180;
      local_158 = uVar44;
      local_1d0 = uVar54;
      local_1b0 = uVar28;
    }
  }
LAB_01bdad2e:
  uVar42 = uVar42 + 1;
  bVar22 = !bVar56;
  local_120 = local_1b0;
  bVar56 = false;
  if (bVar22) goto LAB_01bd9bb6;
  goto LAB_01bdabed;
code_r0x01bd9d06:
  uVar44 = uVar44 - 8;
  lVar55 = lVar55 + 8;
  if (uVar44 < 8) goto code_r0x01bd9d14;
  goto LAB_01bd9cf8;
code_r0x01bd9d14:
  lVar41 = lVar37 + lVar55;
  puVar62 = (ulong *)(lVar55 + (long)puVar2);
LAB_01bd9d23:
  if (uVar44 != 0) {
    uVar35 = 0;
    do {
      uVar31 = uVar35;
      if (*(char *)(lVar41 + uVar35) != *(char *)((long)puVar62 + uVar35)) break;
      uVar35 = uVar35 + 1;
      uVar31 = uVar44;
    } while (uVar44 != uVar35);
    lVar41 = lVar41 + uVar31;
  }
  uVar44 = lVar41 - lVar37;
LAB_01bd9d5f:
  if ((1 < uVar44) && (uVar35 = uVar44 * 0x87 + 0x78f, local_158 < uVar35)) {
    if (lVar57 != 0) {
      uVar35 = uVar35 - ((0x1ca10U >> ((byte)lVar57 & 2) & 4) + 0x27);
    }
    if (local_158 < uVar35) {
      if (uVar49 < uVar44) {
        uVar49 = uVar44;
      }
      local_184 = 0;
      local_158 = uVar35;
      local_128 = uVar28;
      local_120 = uVar44;
    }
  }
LAB_01bd9dc5:
  lVar57 = lVar57 + 1;
  if (lVar57 == 4) goto code_r0x01bd9dd2;
  goto LAB_01bd9cb9;
code_r0x01bd9dd2:
  if (uVar6 != 0xffff) {
LAB_01bd9ed9:
    uVar23 = *puVar59;
    uVar35 = (ulong)(uVar23 & 0x7fffffff);
    uVar44 = uVar54 - uVar35;
    uVar28 = uVar42 - uVar35;
    if (local_1b8 <= uVar42 - uVar35) {
      uVar28 = local_1b8;
    }
    if ((((uVar44 <= uVar27) && (uVar63 + uVar49 <= ringbuffer_mask)) && (uVar49 < uVar28)) &&
       (ringbuffer[uVar63 + uVar49] == *(uint8_t *)((long)puVar29 + uVar49 + uVar35))) {
      puVar61 = (ulong *)(uVar35 + (long)puVar29);
      puVar62 = puVar61;
      puVar40 = puVar2;
      if (7 < uVar28) {
        lVar57 = 0;
        puVar50 = puVar61;
LAB_01bd9e2b:
        if (*puVar40 == *puVar50) goto code_r0x01bd9e36;
        uVar35 = *puVar50 ^ *puVar40;
        uVar28 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = (uVar28 >> 3 & 0x1fffffff) - lVar57;
        goto LAB_01bd9e90;
      }
      goto LAB_01bd9e5d;
    }
    goto LAB_01bd9f09;
  }
LAB_01bd9f11:
  sVar66 = sVar66 + 1;
  if (sVar66 == sVar14) goto LAB_01bd9f39;
  goto LAB_01bd9bf4;
code_r0x01bd9e36:
  puVar40 = puVar40 + 1;
  puVar50 = puVar50 + 1;
  lVar41 = uVar28 + lVar57;
  lVar57 = lVar57 + -8;
  if (lVar41 - 8U < 8) goto code_r0x01bd9e50;
  goto LAB_01bd9e2b;
code_r0x01bd9e50:
  uVar28 = uVar28 + lVar57;
  puVar62 = puVar50;
  if (uVar28 != 0) {
LAB_01bd9e5d:
    puVar50 = (ulong *)((long)puVar62 + uVar28);
    uVar35 = 0;
    do {
      if (*(char *)((long)puVar62 + uVar35) != *(char *)((long)puVar40 + uVar35)) {
        puVar50 = (ulong *)((long)puVar62 + uVar35);
        break;
      }
      uVar35 = uVar35 + 1;
    } while (uVar28 != uVar35);
  }
  uVar28 = (long)puVar50 - (long)puVar61;
LAB_01bd9e90:
  if (3 < uVar28) {
    iVar25 = 0x1f;
    if ((uint)uVar44 != 0) {
      for (; (uint)uVar44 >> iVar25 == 0; iVar25 = iVar25 + -1) {
      }
    }
    uVar35 = (ulong)(iVar25 * -0x1e + 0x780) + uVar28 * 0x87;
    if (local_158 < uVar35) {
      local_184 = 0;
      uVar49 = uVar28;
      local_158 = uVar35;
      local_128 = uVar44;
      local_120 = uVar28;
    }
  }
LAB_01bd9f09:
  puVar59 = puVar59 + 1;
  if ((int)uVar23 < 0) goto LAB_01bd9f11;
  goto LAB_01bd9ed9;
code_r0x01bda149:
  uVar64 = uVar64 - 8;
  lVar57 = lVar57 + 8;
  if (uVar64 < 8) goto code_r0x01bda157;
  goto LAB_01bda13c;
code_r0x01bda157:
  puVar60 = puVar36 + lVar57;
  puVar58 = puVar45 + lVar57;
LAB_01bda15e:
  if (uVar64 != 0) {
    uVar38 = 0;
    do {
      uVar39 = uVar38;
      if (puVar60[uVar38] != puVar58[uVar38]) break;
      uVar38 = uVar38 + 1;
      uVar39 = uVar64;
    } while (uVar64 != uVar38);
    puVar60 = puVar60 + uVar39;
  }
  uVar64 = (long)puVar60 - (long)puVar36;
LAB_01bda1ae:
  if (((2 < uVar64) || ((uVar35 < 2 && (uVar64 == 2)))) &&
     (uVar38 = uVar64 * 0x87 + 0x78f, local_1c0 < uVar38)) {
    if (uVar35 != 0) {
      uVar38 = uVar38 - ((0x1ca10U >> ((byte)uVar35 & 0xe) & 0xe) + 0x27);
    }
    if (local_1c0 < uVar38) {
      uVar42 = uVar64;
      local_1d0 = uVar64;
      local_1c8 = uVar31;
      local_1c0 = uVar38;
    }
  }
LAB_01bda21e:
  uVar35 = uVar35 + 1;
  if (uVar35 == (long)iVar25) goto LAB_01bda248;
  goto LAB_01bda0d6;
code_r0x01bda343:
  uVar38 = uVar38 - 8;
  lVar57 = lVar57 + 8;
  if (uVar38 < 8) goto code_r0x01bda351;
  goto LAB_01bda335;
code_r0x01bda351:
  puVar45 = puVar60 + lVar57;
  puVar62 = (ulong *)(lVar57 + (long)puVar2);
LAB_01bda358:
  puVar58 = puVar45;
  if (uVar38 != 0) {
    puVar58 = puVar45 + uVar38;
    uVar39 = 0;
    do {
      if (puVar45[uVar39] != *(uint8_t *)((long)puVar62 + uVar39)) {
        puVar58 = puVar45 + uVar39;
        break;
      }
      uVar39 = uVar39 + 1;
    } while (uVar38 != uVar39);
  }
  uVar38 = (long)puVar58 - (long)puVar60;
LAB_01bda397:
  if (3 < uVar38) {
    iVar65 = 0x1f;
    if ((uint)uVar64 != 0) {
      for (; (uint)uVar64 >> iVar65 == 0; iVar65 = iVar65 + -1) {
      }
    }
    uVar39 = (ulong)(iVar65 * -0x1e + 0x780) + uVar38 * 0x87;
    if (local_1c0 < uVar39) {
      uVar42 = uVar38;
      local_1d0 = uVar38;
      local_1c8 = uVar64;
      local_1c0 = uVar39;
    }
  }
LAB_01bda3d1:
  if (uVar31 <= uVar35) goto LAB_01bda3e9;
  goto LAB_01bda2bf;
code_r0x01bda520:
  puVar40 = puVar40 + 1;
  puVar62 = puVar62 + 1;
  lVar41 = uVar35 + lVar57;
  lVar57 = lVar57 + -8;
  if (lVar41 - 8U < 8) goto code_r0x01bda53a;
  goto LAB_01bda515;
code_r0x01bda53a:
  uVar31 = lVar57 + uVar35;
  if (lVar57 + uVar35 != 0) {
LAB_01bda547:
    uVar64 = 0;
    do {
      uVar38 = uVar64;
      if (*(char *)((long)puVar62 + uVar64) != *(char *)((long)puVar40 + uVar64)) break;
      uVar64 = uVar64 + 1;
      uVar38 = uVar31;
    } while (uVar31 != uVar64);
    puVar62 = (ulong *)((long)puVar62 + uVar38);
  }
  uVar31 = (long)puVar62 - (long)puVar2;
LAB_01bda57f:
  if (((uVar31 != 0) && (uVar35 < pBVar12->cutoffTransformsCount + uVar31)) &&
     (uVar35 = (ulong)pBVar12->hash_table_words[uVar28] + lVar26 + local_100 +
               ((ulong)((uint)(pBVar12->cutoffTransforms >>
                              ((char)(uVar35 - uVar31) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar35 - uVar31) * 4 << (pBVar17->size_bits_by_length[uVar35] & 0x3f)),
     uVar35 <= uVar27)) {
    iVar20 = 0x1f;
    if ((uint)uVar35 != 0) {
      for (; (uint)uVar35 >> iVar20 == 0; iVar20 = iVar20 + -1) {
      }
    }
    uVar64 = (uVar31 * 0x87 - (ulong)(uint)(iVar20 * 0x1e)) + 0x780;
    if (local_1c0 <= uVar64) {
      iVar65 = (uint)bVar32 - (int)uVar31;
      local_148 = local_148 + 1;
      pHVar13->dict_num_matches = local_148;
      local_1c0 = uVar64;
      local_1c8 = uVar35;
      local_1d0 = uVar31;
    }
  }
LAB_01bda665:
  uVar28 = uVar28 + 1;
  bVar22 = !bVar56;
  local_190 = local_1d0;
  bVar56 = false;
  if (bVar22) goto LAB_01bda685;
  goto LAB_01bda4bf;
code_r0x01bda7f5:
  uVar64 = uVar64 - 8;
  lVar55 = lVar55 + 8;
  if (uVar64 < 8) goto code_r0x01bda803;
  goto LAB_01bda7e7;
code_r0x01bda803:
  puVar62 = (ulong *)(lVar55 + (long)puVar2);
  lVar41 = (long)puVar29 + lVar55 + lVar41;
LAB_01bda811:
  if (uVar64 != 0) {
    uVar38 = 0;
    do {
      uVar39 = uVar38;
      if (*(char *)(lVar41 + uVar38) != *(char *)((long)puVar62 + uVar38)) break;
      uVar38 = uVar38 + 1;
      uVar39 = uVar64;
    } while (uVar64 != uVar38);
    lVar41 = lVar41 + uVar39;
  }
  uVar64 = lVar41 - lVar37;
LAB_01bda852:
  if ((1 < uVar64) && (uVar38 = uVar64 * 0x87 + 0x78f, local_1c0 < uVar38)) {
    if (lVar57 != 0) {
      uVar38 = uVar38 - ((0x1ca10U >> ((byte)lVar57 & 2) & 4) + 0x27);
    }
    if (local_1c0 < uVar38) {
      if (uVar42 < uVar64) {
        uVar42 = uVar64;
      }
      iVar65 = 0;
      local_1c0 = uVar38;
      local_190 = uVar64;
      local_178 = uVar31;
    }
  }
LAB_01bda8b7:
  lVar57 = lVar57 + 1;
  if (lVar57 == 4) goto code_r0x01bda8c4;
  goto LAB_01bda7a8;
code_r0x01bda8c4:
  if (uVar6 != 0xffff) {
LAB_01bda8d5:
    uVar52 = *puVar59;
    uVar39 = (ulong)(uVar52 & 0x7fffffff);
    uVar38 = uVar28 - uVar39;
    uVar64 = uVar35 - uVar39;
    uVar31 = local_1b8;
    if (uVar64 < local_1b8) {
      uVar31 = uVar64;
    }
    if ((((uVar38 <= uVar27) && (uVar44 + uVar42 <= ringbuffer_mask)) && (uVar42 < uVar31)) &&
       (ringbuffer[uVar44 + uVar42] == *(uint8_t *)((long)puVar29 + uVar42 + uVar39))) {
      puVar61 = (ulong *)(uVar39 + (long)puVar29);
      puVar62 = puVar61;
      puVar40 = puVar2;
      if (7 < uVar31) {
        uVar31 = uVar64;
        if (local_d0 < uVar64) {
          uVar31 = local_d0;
        }
        lVar57 = 0;
        puVar50 = puVar61;
LAB_01bda95d:
        if (*puVar40 == *puVar50) goto code_r0x01bda968;
        uVar64 = *puVar50 ^ *puVar40;
        uVar31 = 0;
        if (uVar64 != 0) {
          for (; (uVar64 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar57;
        goto LAB_01bda9d6;
      }
      goto LAB_01bda99e;
    }
    goto LAB_01bda901;
  }
LAB_01bdaa37:
  sVar66 = sVar66 + 1;
  if (sVar66 == sVar14) goto LAB_01bdaa5c;
  goto LAB_01bda6c9;
code_r0x01bda968:
  puVar40 = puVar40 + 1;
  puVar50 = puVar50 + 1;
  lVar41 = uVar31 + lVar57;
  lVar57 = lVar57 + -8;
  if (lVar41 - 8U < 8) goto code_r0x01bda982;
  goto LAB_01bda95d;
code_r0x01bda982:
  if (local_d0 < uVar64) {
    uVar64 = local_d0;
  }
  uVar31 = uVar64 + lVar57;
  puVar62 = puVar50;
  if (uVar31 != 0) {
LAB_01bda99e:
    puVar50 = (ulong *)((long)puVar62 + uVar31);
    uVar64 = 0;
    do {
      if (*(char *)((long)puVar62 + uVar64) != *(char *)((long)puVar40 + uVar64)) {
        puVar50 = (ulong *)((long)puVar62 + uVar64);
        break;
      }
      uVar64 = uVar64 + 1;
    } while (uVar31 != uVar64);
  }
  uVar31 = (long)puVar50 - (long)puVar61;
LAB_01bda9d6:
  if (3 < uVar31) {
    iVar20 = 0x1f;
    if ((uint)uVar38 != 0) {
      for (; (uint)uVar38 >> iVar20 == 0; iVar20 = iVar20 + -1) {
      }
    }
    uVar64 = (ulong)(iVar20 * -0x1e + 0x780) + uVar31 * 0x87;
    if (local_1c0 < uVar64) {
      iVar65 = 0;
      uVar42 = uVar31;
      local_1c0 = uVar64;
      local_190 = uVar31;
      local_178 = uVar38;
    }
  }
LAB_01bda901:
  puVar59 = puVar59 + 1;
  if ((int)uVar52 < 0) goto LAB_01bdaa37;
  goto LAB_01bda8d5;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}